

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

bool __thiscall
adios2::format::BP5Deserializer::VarShape
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,Dims *Shape)

{
  BP5VarRec *WriterRank_00;
  BP5Deserializer *pBVar1;
  ulong *puVar2;
  reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  BP5VarRec *in_RDX;
  BP5Deserializer *in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  MetaArrayRec *writer_meta_base;
  size_t WriterRank;
  size_t AbsStep;
  BP5VarRec *VarRec;
  void *in_stack_ffffffffffffff88;
  size_t sVar4;
  BP5Deserializer *in_stack_ffffffffffffff90;
  value_type vVar5;
  BP5Deserializer *pBVar6;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  ulong uVar7;
  BP5Deserializer *local_40;
  
  WriterRank_00 = LookupVarByKey(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if ((WriterRank_00->OrigShapeID == GlobalArray) || (WriterRank_00->OrigShapeID == JoinedArray)) {
    if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
      if (in_RDX == (BP5VarRec *)0xffffffffffffffff) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&WriterRank_00->AbsStepFromRel,
                   (size_type)
                   (in_RSI->m_ControlArray).
                   super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&WriterRank_00->AbsStepFromRel,(size_type)in_RDX);
      }
    }
    if (WriterRank_00->OrigShapeID == GlobalArray) {
      local_40 = (BP5Deserializer *)0x0;
      while (pBVar6 = local_40,
            pBVar1 = (BP5Deserializer *)WriterCohortSize(local_40,(size_t)in_stack_ffffffffffffff90)
            , pBVar6 < pBVar1) {
        puVar2 = (ulong *)GetMetadataBase(in_RSI,in_RDX,(size_t)in_RCX,(size_t)WriterRank_00);
        if ((puVar2 != (ulong *)0x0) && (puVar2[3] != 0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          for (uVar7 = 0; uVar7 < *puVar2; uVar7 = uVar7 + 1) {
            vVar5 = *(value_type *)(puVar2[3] + uVar7 * 8);
            pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in_RCX,uVar7);
            *pvVar3 = vVar5;
          }
          return true;
        }
        local_40 = (BP5Deserializer *)((long)&local_40->_vptr_BP5Deserializer + 1);
      }
    }
    else if (WriterRank_00->LastJoinedShape != (size_t *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      for (uVar7 = 0; uVar7 < WriterRank_00->DimCount; uVar7 = uVar7 + 1) {
        sVar4 = WriterRank_00->LastJoinedShape[uVar7];
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RCX,uVar7);
        *pvVar3 = sVar4;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool BP5Deserializer::VarShape(const VariableBase &Var, const size_t RelStep, Dims &Shape) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!((VarRec->OrigShapeID == ShapeID::GlobalArray) ||
          (VarRec->OrigShapeID == ShapeID::JoinedArray)))
    {
        return false;
    }
    size_t AbsStep = RelStep;
    if (m_RandomAccessMode)
    {
        if (RelStep == adios2::EngineCurrentStep)
        {
            AbsStep = VarRec->AbsStepFromRel[Var.m_StepsStart];
        }
        else
        {
            AbsStep = VarRec->AbsStepFromRel[RelStep];
        }
    }
    if (m_FlattenSteps)
    {
        AbsStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == ShapeID::GlobalArray)
    {
        // Take the first shape in any writer that wrote it, they should all be the same
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(AbsStep); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, AbsStep, WriterRank);
            if (writer_meta_base && writer_meta_base->Shape)
            {
                Shape.resize(writer_meta_base->Dims);
                for (size_t i = 0; i < writer_meta_base->Dims; i++)
                {
                    Shape[i] = writer_meta_base->Shape[i];
                }
                return true;
            }
        }
    }
    else
    {
        // Joined array case.  This was calculated during metadata installation
        if (VarRec->LastJoinedShape)
        {
            Shape.resize(VarRec->DimCount);
            for (size_t i = 0; i < VarRec->DimCount; i++)
            {
                Shape[i] = VarRec->LastJoinedShape[i];
            }
            return true;
        }
    }
    return false;
}